

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O2

void anurbs::NurbsCurveGeometry<3l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
  *pcVar1;
  string name;
  class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  local_290;
  bool local_281;
  arg local_280;
  arg local_270;
  char *local_260 [4];
  arg local_240;
  code *local_230;
  undefined8 local_228;
  arg local_220;
  arg local_210;
  code *local_200;
  undefined8 local_1f8;
  arg local_1f0;
  code *local_1e0;
  undefined8 local_1d8;
  arg local_1d0;
  code *local_1c0;
  undefined8 local_1b8;
  code *local_1b0;
  undefined8 local_1a8;
  code *local_1a0;
  undefined8 local_198;
  code *local_190;
  undefined8 local_188;
  code *local_180;
  undefined8 local_178;
  code *local_170;
  undefined8 local_168;
  code *local_160;
  undefined8 local_158;
  code *local_150;
  undefined8 local_148;
  code *local_140;
  undefined8 local_138;
  code *local_130;
  undefined8 local_128;
  arg local_120;
  arg local_110;
  arg local_100;
  arg local_f0;
  arg local_e0;
  arg local_d0;
  arg local_c0;
  arg local_b0;
  arg local_a0;
  arg local_90;
  arg local_80;
  arg_v local_70;
  
  python_name_abi_cxx11_();
  pybind11::
  class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>
  ::class_<>(&local_290,(m->super_object).super_handle.m_ptr,local_260[0]);
  local_270.name = "degree";
  local_270._8_1_ = 2;
  local_280.name = "nb_poles";
  local_280._8_1_ = 2;
  local_281 = false;
  local_80.name = "is_rational";
  local_80._8_1_ = 2;
  pybind11::arg::operator=(&local_70,&local_80,&local_281);
  pybind11::detail::initimpl::constructor<const_long,_const_long,_const_bool>::
  execute<pybind11::class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg_v,_0>
            (&local_290,&local_270,&local_280,&local_70);
  local_90.name = "degree";
  local_90._8_1_ = 2;
  local_a0.name = "knots";
  local_a0._8_1_ = 2;
  local_b0.name = "poles";
  local_b0._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<const_long,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>_>
  ::
  execute<pybind11::class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_0>
            (&local_290,&local_90,&local_a0,&local_b0);
  local_c0.name = "degree";
  local_c0._8_1_ = 2;
  local_d0.name = "knots";
  local_d0._8_1_ = 2;
  local_e0.name = "poles";
  local_e0._8_1_ = 2;
  local_f0.name = "weights";
  local_f0._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<const_long,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::
  execute<pybind11::class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_pybind11::arg,_0>
            (&local_290,&local_c0,&local_d0,&local_e0,&local_f0);
  local_100.name = "degree";
  local_100._8_1_ = 2;
  local_110.name = "knots";
  local_110._8_1_ = 2;
  local_120.name = "control_points";
  local_120._8_1_ = 2;
  pybind11::detail::initimpl::
  constructor<const_long,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_std::vector<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>,_std::allocator<std::pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_double>_>_>_>
  ::
  execute<pybind11::class_<anurbs::NurbsCurveGeometry<3L>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::NurbsCurveGeometry<3L>_>_>,_pybind11::arg,_pybind11::arg,_pybind11::arg,_0>
            (&local_290,&local_100,&local_110,&local_120);
  local_130 = NurbsCurveGeometry<3L>::is_rational;
  local_128 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def_property_readonly<bool(anurbs::NurbsCurveGeometry<3l>::*)()const>
                        ((class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
                          *)&local_290,"is_rational",(offset_in_Model_to_subr *)&local_130);
  local_140 = NurbsCurveGeometry<3L>::nb_knots;
  local_138 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsCurveGeometry<3l>::*)()const>
                        (pcVar1,"nb_knots",(offset_in_Model_to_subr *)&local_140);
  local_150 = NurbsCurveGeometry<3L>::nb_poles;
  local_148 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def_property_readonly<long(anurbs::NurbsCurveGeometry<3l>::*)()const>
                        (pcVar1,"nb_poles",(offset_in_Model_to_subr *)&local_150);
  local_160 = NurbsCurveGeometry<3L>::knots;
  local_158 = 0;
  local_170 = NurbsCurveGeometry<3L>::set_knots;
  local_168 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsCurveGeometry<3l>::*)(),void(anurbs::NurbsCurveGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"knots",(offset_in_Model_to_subr *)&local_160,
                         (offset_in_Model_to_subr *)&local_170);
  local_180 = NurbsCurveGeometry<3L>::poles;
  local_178 = 0;
  local_190 = NurbsCurveGeometry<3L>::set_poles;
  local_188 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>,0,Eigen::OuterStride<_1>>(anurbs::NurbsCurveGeometry<3l>::*)(),void(anurbs::NurbsCurveGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>)>
                        (pcVar1,"poles",(offset_in_Model_to_subr *)&local_180,
                         (offset_in_Model_to_subr *)&local_190);
  local_1a0 = NurbsCurveGeometry<3L>::weights;
  local_198 = 0;
  local_1b0 = NurbsCurveGeometry<3L>::set_weights;
  local_1a8 = 0;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def_property<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>(anurbs::NurbsCurveGeometry<3l>::*)(),void(anurbs::NurbsCurveGeometry<3l>::*)(Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>)>
                        (pcVar1,"weights",(offset_in_Model_to_subr *)&local_1a0,
                         (offset_in_Model_to_subr *)&local_1b0);
  local_1c0 = NurbsCurveGeometry<3L>::greville_point;
  local_1b8 = 0;
  local_1d0.name = "index";
  local_1d0._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::def<double(anurbs::NurbsCurveGeometry<3l>::*)(long)const,pybind11::arg>
                        (pcVar1,"greville_point",(offset_in_Model_to_subr *)&local_1c0,&local_1d0);
  local_1e0 = NurbsCurveGeometry<3L>::nonzero_pole_indices_at_span;
  local_1d8 = 0;
  local_1f0.name = "span";
  local_1f0._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def<std::vector<long,std::allocator<long>>(anurbs::NurbsCurveGeometry<3l>::*)(long)const,pybind11::arg>
                        (pcVar1,"nonzero_pole_indices_at_span",(offset_in_Model_to_subr *)&local_1e0
                         ,&local_1f0);
  local_200 = NurbsCurveGeometry<3L>::shape_functions_at;
  local_1f8 = 0;
  local_210.name = "t";
  local_210._8_1_ = 2;
  local_220.name = "order";
  local_220._8_1_ = 2;
  pcVar1 = (class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
            *)pybind11::
              class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
              ::
              def<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(anurbs::NurbsCurveGeometry<3l>::*)(double,long)const,pybind11::arg,pybind11::arg>
                        (pcVar1,"shape_functions_at",(offset_in_Model_to_subr *)&local_200,
                         &local_210,&local_220);
  local_230 = NurbsCurveGeometry<3L>::span_at;
  local_228 = 0;
  local_240.name = "t";
  local_240._8_1_ = 2;
  pybind11::
  class_<anurbs::NurbsCurveGeometry<3l>,anurbs::CurveBase<3l>,std::shared_ptr<anurbs::NurbsCurveGeometry<3l>>>
  ::def<long(anurbs::NurbsCurveGeometry<3l>::*)(double)const,pybind11::arg>
            (pcVar1,"span_at",(offset_in_Model_to_subr *)&local_230,&local_240);
  pybind11::arg_v::~arg_v(&local_70);
  pybind11::object::~object((object *)&local_290);
  Model::register_python_data_type<anurbs::NurbsCurveGeometry<3l>>(m,model);
  std::__cxx11::string::~string((string *)local_260);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = NurbsCurveGeometry<TDimension>;
        using Base = CurveBase<TDimension>; 
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            // constructors
            .def(py::init<const Index, const Index, const bool>(), "degree"_a, "nb_poles"_a, "is_rational"_a=false)
            .def(py::init<const Index, const Knots, const Poles>(), "degree"_a, "knots"_a, "poles"_a)
            .def(py::init<const Index, const Knots, const Poles, const Weights>(), "degree"_a, "knots"_a, "poles"_a, "weights"_a)
            .def(py::init<const Index, const Knots, const std::vector<ControlPoint>>(), "degree"_a, "knots"_a, "control_points"_a)
            // read-only properties
            .def_property_readonly("is_rational", &Type::is_rational)
            .def_property_readonly("nb_knots", &Type::nb_knots)
            .def_property_readonly("nb_poles", &Type::nb_poles)
            // properties
            .def_property("knots", py::overload_cast<>(&Type::knots), &Type::set_knots)
            .def_property("poles", py::overload_cast<>(&Type::poles), &Type::set_poles)
            .def_property("weights", py::overload_cast<>(&Type::weights), &Type::set_weights)
            // methods
            .def("greville_point", &Type::greville_point, "index"_a)
            .def("nonzero_pole_indices_at_span", &Type::nonzero_pole_indices_at_span, "span"_a)
            .def("shape_functions_at", &Type::shape_functions_at, "t"_a, "order"_a)
            .def("span_at", &Type::span_at, "t"_a)
            // .def("clone", &Type::clone)
        ;

        Model::register_python_data_type<Type>(m, model);
    }